

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Scene * __thiscall CGL::GLScene::Scene::get_static_scene(Scene *this)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  reference ppSVar4;
  undefined4 extraout_var_00;
  Scene *pSVar5;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_> *in_RDI;
  SceneLight *light;
  iterator __end2_1;
  iterator __begin2_1;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *__range2_1;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range2;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  staticLights;
  vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
  staticObjects;
  vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>
  *in_stack_ffffffffffffff48;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  *in_stack_ffffffffffffff50;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  *in_stack_ffffffffffffff68;
  Scene *in_stack_ffffffffffffff70;
  __normal_iterator<CGL::GLScene::SceneLight_**,_std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>_>
  local_80;
  vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
  *local_78;
  undefined8 local_60;
  SceneObject *local_58;
  SceneObject **local_50;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  local_48 [9];
  
  std::vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>::
  vector((vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
          *)0x1388f9);
  std::vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>::
  vector((vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
          *)0x138906);
  local_48[0]._M_current =
       (SceneObject **)
       std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::begin
                 ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                   *)in_stack_ffffffffffffff48);
  local_50 = (SceneObject **)
             std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
             ::end((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                    *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
              ::operator*(local_48);
    local_58 = *ppSVar3;
    iVar2 = (*local_58->_vptr_SceneObject[0xc])();
    local_60 = CONCAT44(extraout_var,iVar2);
    std::vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
    ::push_back((vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
                 *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
    ::operator++(local_48);
  }
  local_78 = in_RDI + 1;
  local_80._M_current =
       (SceneLight **)
       std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::begin
                 (in_stack_ffffffffffffff48);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::end
            (in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CGL::GLScene::SceneLight_**,_std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<CGL::GLScene::SceneLight_**,_std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<CGL::GLScene::SceneLight_**,_std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>_>
              ::operator*(&local_80);
    in_stack_ffffffffffffff70 = (Scene *)*ppSVar4;
    iVar2 = (*(code *)*(in_stack_ffffffffffffff70->objects).
                       super__Vector_base<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)();
    in_stack_ffffffffffffff50 =
         (vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>
          *)CONCAT44(extraout_var_00,iVar2);
    in_stack_ffffffffffffff68 = in_stack_ffffffffffffff50;
    std::vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>::
    push_back(in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<CGL::GLScene::SceneLight_**,_std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>_>
    ::operator++(&local_80);
  }
  pSVar5 = (Scene *)operator_new(0x30);
  SceneObjects::Scene::Scene
            (in_stack_ffffffffffffff70,
             (vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
              *)in_stack_ffffffffffffff68,in_RDI);
  std::vector<CGL::SceneObjects::SceneLight_*,_std::allocator<CGL::SceneObjects::SceneLight_*>_>::
  ~vector(in_RDI);
  std::vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>::
  ~vector((vector<CGL::SceneObjects::SceneObject_*,_std::allocator<CGL::SceneObjects::SceneObject_*>_>
           *)in_RDI);
  return pSVar5;
}

Assistant:

SceneObjects::Scene *Scene::get_static_scene() {
  std::vector<SceneObjects::SceneObject *> staticObjects;
  std::vector<SceneObjects::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    staticObjects.push_back(obj->get_static_object());
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }

  return new SceneObjects::Scene(staticObjects, staticLights);
}